

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_php_generator.cc
# Opt level: O3

void __thiscall
t_php_generator::generate_php_doc(t_php_generator *this,ostream *out,t_function *function)

{
  t_struct *ptVar1;
  t_field *ptVar2;
  t_type *type;
  t_function *ptVar3;
  int iVar4;
  ostream *poVar5;
  pointer pptVar6;
  stringstream ss;
  string local_248;
  ostream *local_228;
  t_function *local_220;
  string local_218;
  string local_1f8;
  string local_1d8;
  stringstream local_1b8 [16];
  undefined1 local_1a8 [376];
  
  local_228 = out;
  std::__cxx11::stringstream::stringstream(local_1b8);
  if ((function->super_t_doc).has_doc_ == true) {
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,(function->super_t_doc).doc_._M_dataplus._M_p,
                        (function->super_t_doc).doc_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  }
  ptVar1 = function->arglist_;
  pptVar6 = (ptVar1->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  local_220 = function;
  if (pptVar6 !=
      (ptVar1->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      ptVar2 = *pptVar6;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"@param ",7);
      type_to_phpdoc_abi_cxx11_(&local_248,this,ptVar2->type_);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,local_248._M_dataplus._M_p,local_248._M_string_length
                         );
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," $",2);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,(ptVar2->name_)._M_dataplus._M_p,(ptVar2->name_)._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248._M_dataplus._M_p != &local_248.field_2) {
        operator_delete(local_248._M_dataplus._M_p);
      }
      if ((ptVar2->super_t_doc).has_doc_ == true) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," ",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,(ptVar2->super_t_doc).doc_._M_dataplus._M_p,
                   (ptVar2->super_t_doc).doc_._M_string_length);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,::endl_abi_cxx11_._M_dataplus._M_p,
                 ::endl_abi_cxx11_._M_string_length);
      pptVar6 = pptVar6 + 1;
    } while (pptVar6 !=
             (ptVar1->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  ptVar3 = local_220;
  type = local_220->returntype_;
  iVar4 = (*(type->super_t_doc)._vptr_t_doc[4])(type);
  if (((char)iVar4 == '\0') || ((type->super_t_doc).has_doc_ == true)) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"@return ",8);
    type_to_phpdoc_abi_cxx11_(&local_248,this,type);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,local_248._M_dataplus._M_p,local_248._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._M_dataplus._M_p != &local_248.field_2) {
      operator_delete(local_248._M_dataplus._M_p);
    }
    if ((type->super_t_doc).has_doc_ == true) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," ",1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,(type->super_t_doc).doc_._M_dataplus._M_p,
                 (type->super_t_doc).doc_._M_string_length);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,::endl_abi_cxx11_._M_dataplus._M_p,
               ::endl_abi_cxx11_._M_string_length);
  }
  ptVar1 = ptVar3->xceptions_;
  pptVar6 = (ptVar1->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (pptVar6 !=
      (ptVar1->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      ptVar2 = *pptVar6;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"@throws ",8);
      type_to_phpdoc_abi_cxx11_(&local_248,this,ptVar2->type_);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,local_248._M_dataplus._M_p,local_248._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248._M_dataplus._M_p != &local_248.field_2) {
        operator_delete(local_248._M_dataplus._M_p);
      }
      if ((ptVar2->super_t_doc).has_doc_ == true) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," ",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,(ptVar2->super_t_doc).doc_._M_dataplus._M_p,
                   (ptVar2->super_t_doc).doc_._M_string_length);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,::endl_abi_cxx11_._M_dataplus._M_p,
                 ::endl_abi_cxx11_._M_string_length);
      pptVar6 = pptVar6 + 1;
    } while (pptVar6 !=
             (ptVar1->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,"/**\n","");
  local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8," * ","");
  std::__cxx11::stringbuf::str();
  local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_218," */\n","");
  t_generator::generate_docstring_comment
            ((t_generator *)this,local_228,&local_248,&local_1f8,&local_1d8,&local_218);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
    operator_delete(local_1f8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != &local_248.field_2) {
    operator_delete(local_248._M_dataplus._M_p);
  }
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  return;
}

Assistant:

void t_php_generator::generate_php_doc(ostream& out, t_function* function) {
  stringstream ss;
  if (function->has_doc()) {
    ss << function->get_doc() << endl;
  }

  // generate parameter types doc
  const vector<t_field*>& args = function->get_arglist()->get_members();
  vector<t_field*>::const_iterator a_iter;
  for (a_iter = args.begin(); a_iter != args.end(); ++a_iter) {
    t_field* arg = *a_iter;
    ss << "@param " << type_to_phpdoc(arg->get_type()) << " $" << arg->get_name();
    if (arg->has_doc()) {
      ss << " " << arg->get_doc();
    }
    ss << endl;
  }

  // generate return type doc
  t_type* ret_type = function->get_returntype();
  if (!ret_type->is_void() || ret_type->has_doc()) {
    ss << "@return " << type_to_phpdoc(ret_type);
    if (ret_type->has_doc()) {
      ss << " " << ret_type->get_doc();
    }
    ss << endl;
  }

  // generate exceptions doc
  const vector<t_field*>& excs = function->get_xceptions()->get_members();
  vector<t_field*>::const_iterator e_iter;
  for (e_iter = excs.begin(); e_iter != excs.end(); ++e_iter) {
    t_field* exc = *e_iter;
    ss << "@throws " << type_to_phpdoc(exc->get_type());
    if (exc->has_doc()) {
      ss << " " << exc->get_doc();
    }
    ss << endl;
  }

  generate_docstring_comment(out, "/**\n", " * ", ss.str(), " */\n");
}